

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QChar * QStringConverterICU::toUtf16(QChar *out,QByteArrayView in,State *state)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  const_pointer pvVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  undefined1 *in_RCX;
  QChar *in_RDI;
  long in_FS_OFFSET;
  int32_t leftOver;
  UBool flush;
  UChar_conflict *targetLimit;
  qsizetype length;
  const_pointer sourceLimit;
  UConverter *icu_conv;
  void *context;
  UConverterToUCallback action;
  UChar_conflict *target;
  const_pointer source;
  UErrorCode err;
  Flag in_stack_ffffffffffffff6c;
  QFlagsStorage<QStringConverterBase::Flag> *this;
  undefined1 *local_40;
  undefined1 *local_38;
  QChar *local_30;
  const_pointer local_28;
  QFlagsStorage<QStringConverterBase::Flag> local_1c;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ensureConverter((State *)0x548e00);
  uVar1 = *(undefined8 *)(in_RCX + 0x18);
  local_1c.i = 0;
  local_28 = QByteArrayView::data(&local_18);
  pvVar4 = QByteArrayView::data(&local_18);
  qVar5 = QByteArrayView::size(&local_18);
  qVar6 = QByteArrayView::size(&local_18);
  qVar6 = toLen(qVar6);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = in_RDI;
  ucnv_getToUCallBack_70(uVar1,&local_38,&local_40);
  if (local_40 != in_RCX) {
    ucnv_setToUCallBack_70(uVar1,local_38,in_RCX,0,0,&local_1c);
  }
  this = &local_1c;
  ucnv_toUnicode_70(uVar1,&local_30,in_RDI + qVar6,&local_28,pvVar4 + qVar5,0,0);
  bVar2 = QFlags<QStringConverterBase::Flag>::testFlag
                    ((QFlags<QStringConverterBase::Flag> *)this,in_stack_ffffffffffffff6c);
  if ((bVar2) && (iVar3 = ucnv_toUCountPending_70(uVar1,&local_1c), iVar3 != 0)) {
    ucnv_reset_70(uVar1);
    *(long *)(in_RCX + 0x10) = (long)iVar3 + *(long *)(in_RCX + 0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

static QChar *toUtf16(QChar *out, QByteArrayView in, QStringConverter::State *state)
    {
        QT_COM_THREAD_INIT
        ensureConverter(state);

        auto icu_conv = static_cast<UConverter *>(state->d[0]);
        UErrorCode err = U_ZERO_ERROR;
        auto source = in.data();
        auto sourceLimit = in.data() + in.size();

        qsizetype length = toLen(in.size());

        UChar *target = reinterpret_cast<UChar *>(out);
        auto targetLimit = target + length;
        // We explicitly clean up anyway, so no need to set flush to true,
        // which would just reset the converter.
        UBool flush = false;

        // If the QStringConverter was moved, the state that we used as a context is stale now.
        UConverterToUCallback action;
        const void *context;
        ucnv_getToUCallBack(icu_conv, &action, &context);
        if (context != state)
             ucnv_setToUCallBack(icu_conv, action, state, nullptr, nullptr, &err);

        ucnv_toUnicode(icu_conv, &target, targetLimit, &source, sourceLimit, nullptr, flush, &err);
        // We did reserve enough space:
        Q_ASSERT(err != U_BUFFER_OVERFLOW_ERROR);
        if (state->flags.testFlag(QStringConverter::Flag::Stateless)) {
            if (auto leftOver = ucnv_toUCountPending(icu_conv, &err)) {
                ucnv_reset(icu_conv);
                state->invalidChars += leftOver;
            }
        }
        return reinterpret_cast<QChar *>(target);
    }